

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_frameSizeInfo * ZSTD_findFrameSizeInfo(void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  size_t sVar3;
  ulong in_RDX;
  long in_RSI;
  ZSTD_frameSizeInfo *in_RDI;
  size_t cBlockSize;
  blockProperties_t blockProperties;
  size_t ret;
  ZSTD_frameHeader zfh;
  size_t nbBlocks;
  size_t remainingSize;
  BYTE *ipstart;
  BYTE *ip;
  ZSTD_frameSizeInfo frameSizeInfo;
  blockProperties_t *in_stack_ffffffffffffff48;
  ZSTD_frameHeader *in_stack_ffffffffffffff50;
  ZSTD_frameSizeInfo *srcSize_00;
  void *in_stack_ffffffffffffff68;
  int local_88;
  unsigned_long_long local_78;
  uint local_68;
  uint local_60;
  int local_58;
  size_t local_48;
  ulong local_40;
  long local_30;
  size_t local_28;
  ulong local_20;
  unsigned_long_long local_18;
  ulong local_10;
  long local_8;
  
  srcSize_00 = in_RDI;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(&local_28,0,0x18);
  if ((local_10 < 8) ||
     (UVar1 = MEM_readLE32(in_stack_ffffffffffffff48), (UVar1 & 0xfffffff0) != 0x184d2a50)) {
    local_48 = 0;
    sVar3 = ZSTD_getFrameHeader(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x28833e);
    uVar2 = ZSTD_isError(0x28834d);
    if (uVar2 == 0) {
      if (sVar3 == 0) {
        local_30 = local_8 + (ulong)local_60;
        local_40 = local_10 - local_60;
        do {
          sVar3 = ZSTD_getcBlockSize(in_RDI,(size_t)in_stack_ffffffffffffff50,
                                     in_stack_ffffffffffffff48);
          uVar2 = ZSTD_isError(0x2883d6);
          if (uVar2 != 0) {
            ZSTD_errorFrameSizeInfo(in_RDI,sVar3);
            return srcSize_00;
          }
          if (local_40 < sVar3 + 3) {
            ZSTD_errorFrameSizeInfo(in_RDI,0xffffffffffffffb8);
            return srcSize_00;
          }
          local_30 = sVar3 + 3 + local_30;
          local_40 = local_40 - (sVar3 + 3);
          local_48 = local_48 + 1;
        } while (local_88 == 0);
        if (local_58 != 0) {
          if (local_40 < 4) {
            ZSTD_errorFrameSizeInfo(in_RDI,0xffffffffffffffb8);
            return srcSize_00;
          }
          local_30 = local_30 + 4;
        }
        if (local_78 == 0xffffffffffffffff) {
          local_78 = local_48 * local_68;
        }
        in_RDI->nbBlocks = local_48;
        in_RDI->compressedSize = local_30 - local_8;
        in_RDI->decompressedBound = local_78;
      }
      else {
        ZSTD_errorFrameSizeInfo(in_RDI,0xffffffffffffffb8);
      }
    }
    else {
      ZSTD_errorFrameSizeInfo(in_RDI,sVar3);
    }
  }
  else {
    local_20 = readSkippableFrameSize(in_stack_ffffffffffffff68,(size_t)srcSize_00);
    uVar2 = ZSTD_isError(0x288289);
    if ((uVar2 == 0) && (local_10 < local_20)) {
      __assert_fail("ZSTD_isError(frameSizeInfo.compressedSize) || frameSizeInfo.compressedSize <= srcSize"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9e32,"ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void *, size_t)");
    }
    in_RDI->nbBlocks = local_28;
    in_RDI->compressedSize = local_20;
    in_RDI->decompressedBound = local_18;
  }
  return srcSize_00;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    ZSTD_memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.nbBlocks = nbBlocks;
        frameSizeInfo.compressedSize = (size_t)(ip - ipstart);
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : (unsigned long long)nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}